

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O3

int __thiscall MeCab::anon_unknown_0::ModelImpl::open(ModelImpl *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  char *str;
  int __oflag_00;
  Param param;
  Param local_260;
  
  Param::Param(&local_260);
  iVar2 = Param::open(&local_260,__file,0x140130);
  if ((char)iVar2 != '\0') {
    bVar1 = load_dictionary_resource(&local_260);
    if (bVar1) {
      iVar2 = open(this,(char *)&local_260,__oflag_00);
      goto LAB_001206a5;
    }
  }
  str = whatlog::str(&local_260.what_);
  setGlobalError(str);
  iVar2 = 0;
LAB_001206a5:
  Param::~Param(&local_260);
  return iVar2;
}

Assistant:

bool ModelImpl::open(const char *arg) {
  Param param;
  if (!param.open(arg, long_options) ||
      !load_dictionary_resource(&param)) {
    setGlobalError(param.what());
    return false;
  }
  return open(param);
}